

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

string * __thiscall
RenX_ServerListPlugin::server_as_json_abi_cxx11_
          (string *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  size_type sVar1;
  char *pcVar2;
  size_type sVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  size_type sVar7;
  char **this_00;
  reference pbVar8;
  reference pvVar9;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  string_view sVar10;
  size_type local_458;
  char *local_450;
  undefined8 local_448;
  size_t local_440;
  size_type local_438;
  char *local_430;
  size_type local_428;
  char *local_420;
  undefined4 local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e0;
  undefined4 local_3d8;
  char *local_3d0;
  undefined4 local_3c8;
  char *local_3c0;
  undefined4 local_3b8;
  uint local_3b0;
  size_type local_3a8;
  const_pointer local_3a0;
  basic_string_view<char,_std::char_traits<char>_> *local_390;
  size_type local_388;
  uint local_37c;
  undefined1 *local_378;
  undefined4 local_36c;
  undefined8 local_368;
  char *local_360;
  byte local_355;
  undefined4 local_354;
  char *local_350;
  int local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined4 local_33c;
  char *local_338;
  byte local_329;
  char *local_328;
  byte local_319;
  char *local_318;
  byte local_309;
  char *local_308;
  byte local_2f9;
  char *local_2f8;
  byte local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  size_type local_2e0;
  char *local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  size_type local_2c8;
  char *local_2c0;
  undefined4 local_2b4;
  size_t local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  size_type local_2a0;
  char *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  size_type local_288;
  char *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  size_type local_270;
  char *local_268;
  undefined8 local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  char *local_250;
  char *local_248;
  long local_240;
  char *local_238;
  size_t local_230;
  string *local_228;
  string *local_220;
  RenX_ServerListPlugin *local_218;
  undefined1 local_209;
  undefined1 auStack_208 [8];
  string_view attribute;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_1f0;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  string server_attributes;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  unsigned_short local_178;
  undefined6 uStack_176;
  size_t sStack_170;
  undefined1 local_160 [8];
  string server_prefix;
  undefined1 auStack_138 [6];
  unsigned_short server_port;
  string_view server_hostname;
  undefined1 local_118 [8];
  string server_version;
  undefined1 local_e8 [8];
  string server_map;
  undefined1 local_b8 [8];
  string server_name;
  undefined1 auStack_88 [8];
  ListServerInfo serverInfo;
  Server *server_local;
  RenX_ServerListPlugin *this_local;
  string *server_json_block;
  
  local_228 = __return_storage_ptr__;
  local_220 = __return_storage_ptr__;
  local_218 = this;
  serverInfo.attributes.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)server;
  getListServerInfo((ListServerInfo *)auStack_88,this,server);
  bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_88);
  if (bVar6) {
    s_abi_cxx11_(local_228,"null",4);
    server_name.field_2._8_4_ = 1;
  }
  else {
    sVar10 = (string_view)RenX::Server::getName();
    local_238 = sVar10._M_str;
    local_230 = sVar10._M_len;
    server_map.field_2._8_8_ = local_230;
    jsonify_abi_cxx11_((string *)local_b8,sVar10);
    local_240 = RenX::Server::getMap();
    join_0x00000010_0x00000000_ =
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)(local_240 + 0x10));
    jsonify_abi_cxx11_((string *)local_e8,join_0x00000010_0x00000000_);
    sVar10 = (string_view)RenX::Server::getGameVersion();
    local_250 = sVar10._M_str;
    local_248 = (char *)sVar10._M_len;
    server_hostname._M_str = local_248;
    jsonify_abi_cxx11_((string *)local_118,sVar10);
    _auStack_138 = (size_t)auStack_88;
    server_hostname._M_len = serverInfo.hostname._M_len;
    server_prefix.field_2._14_2_ = serverInfo.hostname._M_str._0_2_;
    local_178 = serverInfo.port;
    uStack_176 = serverInfo._18_6_;
    sStack_170 = serverInfo.namePrefix._M_len;
    sVar10._M_str = (char *)serverInfo.namePrefix._M_len;
    sVar10._M_len = serverInfo._16_8_;
    jsonify_abi_cxx11_((string *)local_160,sVar10);
    bVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160);
    if (!bVar6) {
      local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   )sv("\"NamePrefix\":\"",0xe);
      join_0x00000010_0x00000000_ = sv("\",",2);
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
                (&local_198,(jessilib *)local_1a8._M_local_buf,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&server_attributes.field_2 + 8),in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 &local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    std::__cxx11::string::string((string *)&__range2);
    bVar6 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&serverInfo.namePrefix._M_str);
    if (!bVar6) {
      sVar7 = std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&serverInfo.namePrefix._M_str);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 sVar7 * 0x10 + 0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 "\"Attributes\":[");
      this_00 = &serverInfo.namePrefix._M_str;
      __end2 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)this_00);
      local_1f0._M_current =
           (basic_string_view<char,_std::char_traits<char>_> *)
           std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)this_00);
      while (bVar6 = __gnu_cxx::
                     operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               (&__end2,&local_1f0), ((bVar6 ^ 0xffU) & 1) != 0) {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::operator*(&__end2);
        auStack_208 = (undefined1  [8])pbVar8->_M_len;
        attribute._M_len = (size_t)pbVar8->_M_str;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   '\"');
        std::__cxx11::string::operator+=
                  ((string *)&__range2,
                   (basic_string_view<char,_std::char_traits<char>_> *)auStack_208);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   "\",");
        __gnu_cxx::
        __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::operator++(&__end2);
      }
      local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2;
      pvVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                         (local_258);
      *pvVar9 = ']';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (local_258,',');
    }
    local_209 = 0;
    local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    local_2a0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_2a8);
    local_298 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                data(local_2a8);
    local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
    local_288 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_290);
    local_280 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                data(local_290);
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
    local_270 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_278);
    local_268 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                data(local_278);
    local_260 = RenX::Server::getBotCount();
    local_2b0 = getListedPlayerCount
                          (local_218,
                           (Server *)
                           serverInfo.attributes.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    local_2e0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_2e8);
    local_2d8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                data(local_2e8);
    local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2;
    local_2c8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_2d0);
    local_2c0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                data(local_2d0);
    local_2b4 = RenX::Server::getMineLimit();
    local_2e9 = RenX::Server::isSteamRequired();
    local_2f8 = json_bool_as_cstring((bool)(local_2e9 & 1));
    local_2f9 = RenX::Server::isPrivateMessageTeamOnly();
    local_308 = json_bool_as_cstring((bool)(local_2f9 & 1));
    local_309 = RenX::Server::isPassworded();
    local_318 = json_bool_as_cstring((bool)(local_309 & 1));
    local_319 = RenX::Server::isPrivateMessagingEnabled();
    local_328 = json_bool_as_cstring((bool)(local_319 & 1));
    local_329 = RenX::Server::isRanked();
    local_338 = json_bool_as_cstring((bool)(local_329 & 1));
    local_33c = RenX::Server::getGameType();
    local_340 = RenX::Server::getPlayerLimit();
    local_344 = RenX::Server::getVehicleLimit();
    local_348 = RenX::Server::getTeamMode();
    local_350 = json_bool_as_cstring(local_348 == 3);
    local_354 = RenX::Server::getTeamMode();
    local_355 = RenX::Server::isCratesEnabled();
    local_360 = json_bool_as_cstring((bool)(local_355 & 1));
    local_368 = RenX::Server::getCrateRespawnDelay();
    local_36c = RenX::Server::getTimeLimit();
    sVar5 = local_2b0;
    pcVar4 = local_2c0;
    sVar3 = local_2c8;
    pcVar2 = local_2d8;
    sVar1 = local_2e0;
    local_37c = (uint)(ushort)server_prefix.field_2._14_2_;
    local_390 = (basic_string_view<char,_std::char_traits<char>_> *)auStack_138;
    local_388 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_390);
    local_3a0 = std::basic_string_view<char,_std::char_traits<char>_>::data(local_390);
    local_3a8 = local_388;
    local_3b0 = local_37c;
    local_3b8 = local_36c;
    local_3c0 = local_360;
    local_3c8 = local_354;
    local_3d0 = local_350;
    local_3d8 = local_344;
    local_3e0 = local_340;
    local_3e8 = local_33c;
    local_3f0 = local_338;
    local_3f8 = local_328;
    local_400 = local_318;
    local_408 = local_308;
    local_410 = local_2f8;
    local_418 = local_2b4;
    local_420 = pcVar4;
    local_428 = sVar3;
    local_430 = pcVar2;
    local_438 = sVar1;
    local_440 = sVar5;
    local_448 = local_260;
    local_450 = local_268;
    local_458 = local_270;
    local_378 = (undefined1 *)&local_458;
    string_printf_abi_cxx11_
              (local_228,
               "{\"Name\":\"%.*s\",%.*s\"Current Map\":\"%.*s\",\"Bots\":%u,\"Players\":%u,\"Game Version\":\"%.*s\",%.*s\"Variables\":{\"Mine Limit\":%d,\"bSteamRequired\":%s,\"bPrivateMessageTeamOnly\":%s,\"bPassworded\":%s,\"bAllowPrivateMessaging\":%s,\"bRanked\":%s,\"Game Type\":%d,\"Player Limit\":%d,\"Vehicle Limit\":%d,\"bAutoBalanceTeams\":%s,\"Team Mode\":%d,\"bSpawnCrates\":%s,\"CrateRespawnAfterPickup\":%f,\"Time Limit\":%d},\"Port\":%u,\"IP\":\"%.*s\""
               ,(int)local_368,local_2a0,local_298,local_288,local_280);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (local_228,'}');
    server_name.field_2._8_4_ = 1;
    local_209 = 1;
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  ListServerInfo::~ListServerInfo((ListServerInfo *)auStack_88);
  return local_220;
}

Assistant:

std::string RenX_ServerListPlugin::server_as_json(const RenX::Server &server) {
	ListServerInfo serverInfo = getListServerInfo(server);

	if (serverInfo.hostname.empty()) {
		return "null"s;
	}

	std::string server_name = jsonify(server.getName());
	std::string server_map = jsonify(server.getMap().name);
	std::string server_version = jsonify(server.getGameVersion());
	std::string_view server_hostname = serverInfo.hostname;
	unsigned short server_port = serverInfo.port;
	std::string server_prefix = jsonify(serverInfo.namePrefix);

	// Some members we only include if they're populated
	if (!server_prefix.empty()) {
		server_prefix = jessilib::join<std::string>(R"json("NamePrefix":")json"sv, server_prefix, "\","sv);
	}

	std::string server_attributes;
	if (!serverInfo.attributes.empty()) {
		server_attributes.reserve(16 * serverInfo.attributes.size() + 16);
		server_attributes = R"json("Attributes":[)json";

		for (std::string_view attribute : serverInfo.attributes) {
			server_attributes += '\"';
			server_attributes += attribute;
			server_attributes += "\",";
		}

		server_attributes.back() = ']';
		server_attributes += ',';
	}

	// Build block
	std::string server_json_block = string_printf(R"json({"Name":"%.*s",%.*s"Current Map":"%.*s","Bots":%u,"Players":%u,"Game Version":"%.*s",%.*s"Variables":{"Mine Limit":%d,"bSteamRequired":%s,"bPrivateMessageTeamOnly":%s,"bPassworded":%s,"bAllowPrivateMessaging":%s,"bRanked":%s,"Game Type":%d,"Player Limit":%d,"Vehicle Limit":%d,"bAutoBalanceTeams":%s,"Team Mode":%d,"bSpawnCrates":%s,"CrateRespawnAfterPickup":%f,"Time Limit":%d},"Port":%u,"IP":"%.*s")json",
		server_name.size(), server_name.data(),
		server_prefix.size(), server_prefix.data(),
		server_map.size(), server_map.data(),
		server.getBotCount(),
		getListedPlayerCount(server),
		server_version.size(), server_version.data(),
		server_attributes.size(), server_attributes.data(),
		server.getMineLimit(),
		json_bool_as_cstring(server.isSteamRequired()),
		json_bool_as_cstring(server.isPrivateMessageTeamOnly()),
		json_bool_as_cstring(server.isPassworded()),
		json_bool_as_cstring(server.isPrivateMessagingEnabled()),
		json_bool_as_cstring(server.isRanked()),
		server.getGameType(),
		server.getPlayerLimit(),
		server.getVehicleLimit(),
		json_bool_as_cstring(server.getTeamMode() == 3),
		server.getTeamMode(),
		json_bool_as_cstring(server.isCratesEnabled()),
		server.getCrateRespawnDelay(),
		server.getTimeLimit(),
		server_port,
		server_hostname.size(), server_hostname.data());

	server_json_block += '}';

	return server_json_block;
}